

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metal.h
# Opt level: O3

void __thiscall
phyr::MetalMaterial::MetalMaterial
          (MetalMaterial *this,shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *eta,
          shared_ptr<phyr::Texture<phyr::SampledSpectrum>_> *k,
          shared_ptr<phyr::Texture<double>_> *rough,shared_ptr<phyr::Texture<double>_> *urough,
          shared_ptr<phyr::Texture<double>_> *vrough,bool remapRoughness)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Material)._vptr_Material = (_func_int **)&PTR_computeScatteringFunctions_001a9f38;
  (this->eta).super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (eta->
           super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var1 = (eta->
           super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->eta).super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->k).super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (k->super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  p_Var1 = (k->super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>)
           ._M_refcount._M_pi;
  (this->k).super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->roughness).super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (rough->super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (rough->super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->roughness).super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->uRoughness).super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (urough->super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (urough->super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->uRoughness).super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->vRoughness).super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (vrough->super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (vrough->super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->vRoughness).super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->remapRoughness = remapRoughness;
  return;
}

Assistant:

MetalMaterial(const std::shared_ptr<Texture<Spectrum>>& eta,
                  const std::shared_ptr<Texture<Spectrum>>& k,
                  const std::shared_ptr<Texture<Real>>& rough,
                  const std::shared_ptr<Texture<Real>>& urough,
                  const std::shared_ptr<Texture<Real>>& vrough,
                  bool remapRoughness) :
        eta(eta), k(k), roughness(rough), uRoughness(urough),
        vRoughness(vrough), remapRoughness(remapRoughness) {}